

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.cpp
# Opt level: O2

istream * operator>>(istream *in,Rational *a)

{
  string s;
  string local_78;
  Rational local_58;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::operator>>(in,(string *)&local_78);
  Rational::Rational(&local_58,&local_78);
  Rational::operator=(a,&local_58);
  Rational::~Rational(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return in;
}

Assistant:

std::istream &operator>>(std::istream &in, Rational &a)
{
    std::string s;
    in >> s;
    a = Rational(s);
    return in;
}